

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkStartFrom(Abc_Ntk_t *pNtk,Abc_NtkType_t Type,Abc_NtkFunc_t Func)

{
  int iVar1;
  long lVar2;
  Vec_Int_t *pVVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Vec_Vec_t *pVVar7;
  Abc_Cex_t *pAVar8;
  Vec_Int_t *pVVar9;
  int *__dest;
  void *pvVar10;
  Mio_Library_t *pLib;
  Vec_Ptr_t *pVVar11;
  uint fCopyName;
  long lVar12;
  size_t __size;
  float fVar13;
  float fVar14;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk_00 = Abc_NtkAlloc(Type,Func,1);
    iVar1 = pNtk->nBarBufs;
    pNtk_00->nConstrs = pNtk->nConstrs;
    pNtk_00->nBarBufs = iVar1;
    pcVar4 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar4;
    pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_00->pSpec = pcVar4;
    Abc_NtkCleanCopy(pNtk);
    if ((pNtk->ntkType == ABC_NTK_STRASH) && (pNtk_00->ntkType == ABC_NTK_STRASH)) {
      pAVar5 = Abc_AigConst1(pNtk_00);
      pAVar6 = Abc_AigConst1(pNtk);
      (pAVar6->field_6).pCopy = pAVar5;
    }
    pVVar11 = pNtk->vPis;
    fCopyName = (uint)(Type != ABC_NTK_NETLIST);
    if (0 < pVVar11->nSize) {
      lVar12 = 0;
      do {
        Abc_NtkDupObj(pNtk_00,(Abc_Obj_t *)pVVar11->pArray[lVar12],fCopyName);
        lVar12 = lVar12 + 1;
        pVVar11 = pNtk->vPis;
      } while (lVar12 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vPos;
    if (0 < pVVar11->nSize) {
      lVar12 = 0;
      do {
        Abc_NtkDupObj(pNtk_00,(Abc_Obj_t *)pVVar11->pArray[lVar12],fCopyName);
        lVar12 = lVar12 + 1;
        pVVar11 = pNtk->vPos;
      } while (lVar12 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vBoxes;
    if (0 < pVVar11->nSize) {
      lVar12 = 0;
      do {
        Abc_NtkDupBox(pNtk_00,(Abc_Obj_t *)pVVar11->pArray[lVar12],fCopyName);
        lVar12 = lVar12 + 1;
        pVVar11 = pNtk->vBoxes;
      } while (lVar12 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vCis;
    if (0 < pVVar11->nSize) {
      lVar12 = 0;
      do {
        lVar2 = *(long *)((long)pVVar11->pArray[lVar12] + 0x40);
        *(uint *)(lVar2 + 0x14) =
             *(uint *)(lVar2 + 0x14) & 0xfff |
             *(uint *)((long)pVVar11->pArray[lVar12] + 0x14) & 0xfffff000;
        lVar12 = lVar12 + 1;
        pVVar11 = pNtk->vCis;
      } while (lVar12 < pVVar11->nSize);
    }
    Abc_ManTimeDup(pNtk,pNtk_00);
    if ((Vec_Vec_t *)pNtk->vOnehots != (Vec_Vec_t *)0x0) {
      pVVar7 = Vec_VecDupInt((Vec_Vec_t *)pNtk->vOnehots);
      pNtk_00->vOnehots = (Vec_Ptr_t *)pVVar7;
    }
    if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      pAVar8 = Abc_CexDup(pNtk->pSeqModel,pNtk->nObjCounts[8]);
      pNtk_00->pSeqModel = pAVar8;
    }
    pVVar3 = pNtk->vObjPerm;
    if (pVVar3 != (Vec_Int_t *)0x0) {
      pVVar9 = (Vec_Int_t *)malloc(0x10);
      iVar1 = pVVar3->nSize;
      pVVar9->nSize = iVar1;
      pVVar9->nCap = iVar1;
      if ((long)iVar1 == 0) {
        __size = 0;
        __dest = (int *)0x0;
      }
      else {
        __size = (long)iVar1 << 2;
        __dest = (int *)malloc(__size);
      }
      pVVar9->pArray = __dest;
      memcpy(__dest,pVVar3->pArray,__size);
      pNtk_00->vObjPerm = pVVar9;
    }
    pNtk_00->AndGateDelay = pNtk->AndGateDelay;
    if (pNtk_00->pManTime != (Abc_ManTime_t *)0x0) {
      pvVar10 = Abc_FrameReadLibGen();
      if (((pvVar10 != (void *)0x0) && (pNtk_00->AndGateDelay == 0.0)) &&
         (!NAN(pNtk_00->AndGateDelay))) {
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        fVar13 = Mio_LibraryReadDelayAigNode(pLib);
        pNtk_00->AndGateDelay = fVar13;
      }
    }
    if ((((pNtk->AndGateDelay != 0.0) || (NAN(pNtk->AndGateDelay))) &&
        ((pNtk->pManTime != (Abc_ManTime_t *)0x0 &&
         ((Type == ABC_NTK_STRASH && (pNtk->ntkType != ABC_NTK_STRASH)))))) &&
       (pVVar11 = pNtk->vCis, 0 < pVVar11->nSize)) {
      lVar12 = 0;
      do {
        pAVar5 = (Abc_Obj_t *)pVVar11->pArray[lVar12];
        fVar14 = Abc_NodeReadArrivalWorst(pAVar5);
        fVar13 = 0.0;
        if (0.0 <= fVar14) {
          fVar13 = fVar14;
        }
        pvVar10 = (pAVar5->field_6).pTemp;
        *(uint *)((long)pvVar10 + 0x14) =
             *(uint *)((long)pvVar10 + 0x14) & 0xfff | (int)(fVar13 / pNtk->AndGateDelay) << 0xc;
        lVar12 = lVar12 + 1;
        pVVar11 = pNtk->vCis;
      } while (lVar12 < pVVar11->nSize);
    }
    if (pNtk->vCis->nSize != pNtk_00->vCis->nSize) {
      __assert_fail("Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0xa1,"Abc_Ntk_t *Abc_NtkStartFrom(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)");
    }
    if (pNtk->vCos->nSize != pNtk_00->vCos->nSize) {
      __assert_fail("Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0xa2,"Abc_Ntk_t *Abc_NtkStartFrom(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)");
    }
    if (pNtk->nObjCounts[8] != pNtk_00->nObjCounts[8]) {
      __assert_fail("Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0xa3,"Abc_Ntk_t *Abc_NtkStartFrom(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)");
    }
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkStartFrom( Abc_Ntk_t * pNtk, Abc_NtkType_t Type, Abc_NtkFunc_t Func )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj;
    int fCopyNames, i;
    if ( pNtk == NULL )
        return NULL;
    // decide whether to copy the names
    fCopyNames = ( Type != ABC_NTK_NETLIST );
    // start the network
    pNtkNew = Abc_NtkAlloc( Type, Func, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, fCopyNames );
    // transfer logic level
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy->Level = pObj->Level;
    // transfer the names
//    Abc_NtkTrasferNames( pNtk, pNtkNew );
    Abc_ManTimeDup( pNtk, pNtkNew );
    if ( pNtk->vOnehots )
        pNtkNew->vOnehots = (Vec_Ptr_t *)Vec_VecDupInt( (Vec_Vec_t *)pNtk->vOnehots );
    if ( pNtk->pSeqModel )
        pNtkNew->pSeqModel = Abc_CexDup( pNtk->pSeqModel, Abc_NtkLatchNum(pNtk) );
    if ( pNtk->vObjPerm )
        pNtkNew->vObjPerm = Vec_IntDup( pNtk->vObjPerm );
    pNtkNew->AndGateDelay = pNtk->AndGateDelay;
    if ( pNtkNew->pManTime && Abc_FrameReadLibGen() && pNtkNew->AndGateDelay == 0.0 )
        pNtkNew->AndGateDelay = Mio_LibraryReadDelayAigNode((Mio_Library_t *)Abc_FrameReadLibGen());
    // initialize logic level of the CIs
    if ( pNtk->AndGateDelay != 0.0 && pNtk->pManTime != NULL && pNtk->ntkType != ABC_NTK_STRASH && Type == ABC_NTK_STRASH )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pCopy->Level = (int)(Abc_MaxFloat(0, Abc_NodeReadArrivalWorst(pObj)) / pNtk->AndGateDelay);
    }
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkCiNum(pNtk)    == Abc_NtkCiNum(pNtkNew) );
    assert( Abc_NtkCoNum(pNtk)    == Abc_NtkCoNum(pNtkNew) );
    assert( Abc_NtkLatchNum(pNtk) == Abc_NtkLatchNum(pNtkNew) );
    return pNtkNew;
}